

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O1

Endpoint * __thiscall
helics::MessageFederateManager::getEndpoint(MessageFederateManager *this,string_view name)

{
  bool bVar1;
  int iVar2;
  Endpoint **ppEVar3;
  Endpoint *pEVar4;
  int iVar5;
  Endpoint **ppEVar6;
  long lVar7;
  BlockIterator<const_helics::Endpoint,_32,_const_helics::Endpoint_*const_*> ept;
  pthread_rwlock_t *local_50;
  BlockIterator<const_helics::Endpoint,_32,_const_helics::Endpoint_*const_*> local_48;
  
  bVar1 = (this->mLocalEndpoints).enabled;
  if (bVar1 == true) {
    local_50 = (pthread_rwlock_t *)&(this->mLocalEndpoints).m_mutex;
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&local_50->__data);
  }
  else {
    local_50 = (pthread_rwlock_t *)0x0;
  }
  gmlc::containers::
  DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>::find
            (&local_48,
             (DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>
              *)this,name);
  iVar2 = (this->mLocalEndpoints).m_obj.dataStorage.bsize;
  ppEVar6 = (this->mLocalEndpoints).m_obj.dataStorage.dataptr;
  lVar7 = (long)(this->mLocalEndpoints).m_obj.dataStorage.dataSlotIndex;
  if (bVar1 != false) {
    pthread_rwlock_unlock(local_50);
  }
  if (ppEVar6 == (Endpoint **)0x0) {
    ppEVar3 = &gmlc::containers::
               StableBlockVector<helics::Endpoint,_5U,_std::allocator<helics::Endpoint>_>::end::
               emptyValue;
  }
  else {
    ppEVar3 = ppEVar6 + lVar7 + 1;
  }
  ppEVar6 = ppEVar6 + lVar7;
  if (iVar2 == 0x20) {
    ppEVar6 = ppEVar3;
  }
  iVar5 = 0;
  if (iVar2 != 0x20) {
    iVar5 = iVar2;
  }
  pEVar4 = (Endpoint *)invalidEpt;
  if (local_48.vec != ppEVar6) {
    pEVar4 = local_48.ptr;
  }
  if (local_48.offset != iVar5) {
    pEVar4 = local_48.ptr;
  }
  return pEVar4;
}

Assistant:

const Endpoint& MessageFederateManager::getEndpoint(std::string_view name) const
{
    auto sharedEpt = mLocalEndpoints.lock_shared();
    auto ept = sharedEpt->find(name);
    return (ept != sharedEpt.end()) ? (*ept) : invalidEpt;
}